

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbcSave(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Abc_Ntk_t *pAVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  Abc_Ntk_t *pAVar6;
  char *pcVar7;
  float fVar8;
  float fVar9;
  double dVar10;
  
  bVar3 = false;
  Extra_UtilGetoptReset();
  while (iVar4 = Extra_UtilGetopt(argc,argv,"ah"), iVar4 == 0x61) {
    bVar3 = (bool)(bVar3 ^ 1);
  }
  if (iVar4 == -1) {
    pAVar6 = pAbc->pNtkCur;
    if (pAVar6 == (Abc_Ntk_t *)0x0) {
      pcVar7 = "Empty network.\n";
    }
    else {
      if (pAVar6->ntkFunc == ABC_FUNC_MAP) {
        pAVar2 = pAbc->pNtkBest;
        dVar10 = Abc_NtkGetMappedArea(pAVar6);
        fVar8 = (float)dVar10;
        fVar9 = Abc_NtkDelayTrace(pAVar6,(Abc_Obj_t *)0x0,(Abc_Obj_t *)0x0,0);
        uVar1 = pAVar6->nObjCounts[7];
        uVar5 = Abc_NtkLevel(pAVar6);
        if ((((pAVar2 != (Abc_Ntk_t *)0x0) && (pAVar2->vPis->nSize == pAVar6->vPis->nSize)) &&
            (pAVar2->vPos->nSize == pAVar6->vPos->nSize)) &&
           ((pAVar2->nObjCounts[8] == pAVar6->nObjCounts[8] &&
            (iVar4 = strcmp(pAVar2->pName,pAVar6->pName), iVar4 == 0)))) {
          if (bVar3) {
            if (pAbc->nBestNtkNodes <= (int)uVar1) {
              if (pAbc->nBestNtkNodes != uVar1) {
                return 0;
              }
              if (pAbc->nBestNtkArea <= fVar8) {
                return 0;
              }
            }
          }
          else if (pAbc->nBestNtkLevels <= (int)uVar5) {
            if (pAbc->nBestNtkLevels != uVar5) {
              return 0;
            }
            if (pAbc->nBestNtkDelay <= fVar9) {
              return 0;
            }
          }
        }
        pAbc->nBestNtkArea = fVar8;
        pAbc->nBestNtkDelay = fVar9;
        pAbc->nBestNtkNodes = uVar1;
        pAbc->nBestNtkLevels = uVar5;
        printf("\nUpdating the best network (Area = %10.2f  Delay = %10.2f  Nodes = %6d  Level = %6d).\n\n"
               ,(double)fVar8,(double)fVar9,(ulong)uVar1,(ulong)uVar5);
        if (pAbc->pNtkBest != (Abc_Ntk_t *)0x0) {
          Abc_NtkDelete(pAbc->pNtkBest);
        }
        pAVar6 = Abc_NtkDup(pAbc->pNtkCur);
        pAbc->pNtkBest = pAVar6;
        return 0;
      }
      pcVar7 = "Network has no mapping.\n";
    }
    iVar4 = -1;
  }
  else {
    Abc_Print(-2,"usage: save [-ah]\n");
    Abc_Print(-2,"\t        compares and possibly saves network with mapping\n");
    pcVar7 = "yes";
    if (!bVar3) {
      pcVar7 = "no";
    }
    Abc_Print(-2,"\t-a    : toggle using area as the primary metric [default = %s]\n",pcVar7);
    pcVar7 = "\t-h    : print the command usage\n";
    iVar4 = -2;
  }
  Abc_Print(iVar4,pcVar7);
  return 1;
}

Assistant:

int Abc_CommandAbcSave( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fArea = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ah" ) ) != EOF )
    {
        switch ( c )
        {
        case 'a':
            fArea ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pNtkCur == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(pAbc->pNtkCur) )
    {
        Abc_Print( -1, "Network has no mapping.\n" );
        return 1;
    }
    if ( !Abc_NtkCompareWithBest( pAbc->pNtkBest, pAbc->pNtkCur, 
             &pAbc->nBestNtkArea,  &pAbc->nBestNtkDelay, 
             &pAbc->nBestNtkNodes, &pAbc->nBestNtkLevels, fArea ) )
        return 0;
    // save the design as best
    if ( pAbc->pNtkBest ) Abc_NtkDelete( pAbc->pNtkBest );
    pAbc->pNtkBest = Abc_NtkDup(pAbc->pNtkCur);
    return 0;

usage:
    Abc_Print( -2, "usage: save [-ah]\n" );
    Abc_Print( -2, "\t        compares and possibly saves network with mapping\n" );
    Abc_Print( -2, "\t-a    : toggle using area as the primary metric [default = %s]\n", fArea? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}